

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O3

void Kit_SopCreateInverse(Kit_Sop_t *cResult,Vec_Int_t *vInput,int nLits,Vec_Int_t *vMemory)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  uint *puVar6;
  
  uVar1 = vInput->nSize;
  uVar2 = (ulong)uVar1;
  cResult->nCubes = 0;
  if (uVar2 == 0) {
    cResult->pCubes = (uint *)0x0;
  }
  else {
    if ((int)uVar1 < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3a5,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar5 = (long)(int)uVar1 + (long)vMemory->nSize;
    iVar4 = (int)lVar5;
    vMemory->nSize = iVar4;
    if (vMemory->nCap < iVar4) {
      puVar6 = (uint *)0x0;
    }
    else {
      puVar6 = (uint *)(vMemory->pArray + (lVar5 - uVar2));
    }
    cResult->pCubes = puVar6;
    uVar3 = 0;
    do {
      if ((long)vInput->nSize <= (long)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = vInput->pArray[uVar3];
      iVar4 = cResult->nCubes;
      cResult->nCubes = iVar4 + 1;
      puVar6[iVar4] = ((uVar1 >> 1 | uVar1) & 0x55555555) * 3 ^ uVar1;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void Kit_SopCreateInverse( Kit_Sop_t * cResult, Vec_Int_t * vInput, int nLits, Vec_Int_t * vMemory )
{
    unsigned uCube, uMask = 0;
    int i, nCubes = Vec_IntSize(vInput);
    // start the cover
    cResult->nCubes = 0;
    cResult->pCubes = Vec_IntFetch( vMemory, nCubes );
    // add the cubes
//    Vec_IntForEachEntry( vInput, uCube, i )
    for ( i = 0; i < nCubes; i++ )
    {
        uCube = Vec_IntEntry( vInput, i );
        uMask = ((uCube | (uCube >> 1)) & 0x55555555);
        uMask |= (uMask << 1);
        Kit_SopPushCube( cResult, uCube ^ uMask );
    }
}